

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::JobManager::Init(Error *__return_storage_ptr__,JobManager *this,Config *aConf)

{
  bool bVar1;
  Error *pEVar2;
  ErrorCode local_94;
  Error local_90;
  ErrorCode local_64;
  Error local_60;
  undefined1 local_21;
  Config *local_20;
  Config *aConf_local;
  JobManager *this_local;
  Error *error;
  
  local_21 = 0;
  local_20 = aConf;
  aConf_local = (Config *)this;
  this_local = (JobManager *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  Config::operator=(&this->mDefaultConf,local_20);
  security_material::Init(&local_60,local_20);
  pEVar2 = Error::operator=(__return_storage_ptr__,&local_60);
  local_64 = kNone;
  bVar1 = commissioner::operator!=(pEVar2,&local_64);
  Error::~Error(&local_60);
  if (!bVar1) {
    CommissionerAppCreate(&local_90,&this->mDefaultCommissioner,local_20);
    pEVar2 = Error::operator=(__return_storage_ptr__,&local_90);
    local_94 = kNone;
    commissioner::operator!=(pEVar2,&local_94);
    Error::~Error(&local_90);
  }
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::Init(const Config &aConf)
{
    Error error;

    mDefaultConf = aConf;
    SuccessOrExit(error = security_material::Init(aConf));
    SuccessOrExit(error = CommissionerAppCreate(mDefaultCommissioner, aConf));
exit:
    return error;
}